

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O2

int __thiscall ncnn::Interp::load_param(Interp *this,ParamDict *pd)

{
  int iVar1;
  int iVar2;
  float fVar3;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->resize_type = iVar1;
  fVar3 = ParamDict::get(pd,1,1.0);
  this->height_scale = fVar3;
  fVar3 = ParamDict::get(pd,2,1.0);
  this->width_scale = fVar3;
  iVar1 = ParamDict::get(pd,3,0);
  this->output_height = iVar1;
  iVar1 = ParamDict::get(pd,4,0);
  this->output_width = iVar1;
  iVar1 = ParamDict::get(pd,5,0);
  this->dynamic_target_size = iVar1;
  iVar1 = ParamDict::get(pd,6,0);
  this->align_corner = iVar1;
  if ((uint)this->resize_type < 4) {
    if (this->dynamic_target_size == 1) {
      (this->super_Layer).one_blob_only = false;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
    ParamDict::get(&local_40,pd,9,&local_60);
    std::__cxx11::string::operator=((string *)&this->size_expr,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    iVar1 = 0;
    if ((this->size_expr)._M_string_length != 0) {
      iVar2 = count_expression_blobs(&this->size_expr);
      if (1 < iVar2) {
        (this->super_Layer).one_blob_only = false;
        iVar1 = 0;
      }
    }
  }
  else {
    fprintf(_stderr,"unsupported resize type %d");
    fputc(10,_stderr);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int Interp::load_param(const ParamDict& pd)
{
    resize_type = pd.get(0, 0);
    height_scale = pd.get(1, 1.f);
    width_scale = pd.get(2, 1.f);
    output_height = pd.get(3, 0);
    output_width = pd.get(4, 0);
    dynamic_target_size = pd.get(5, 0);
    align_corner = pd.get(6, 0);

    if (resize_type < 0 || resize_type > 3)
    {
        NCNN_LOGE("unsupported resize type %d", resize_type);
        return -1;
    }

    if (dynamic_target_size == 1)
    {
        one_blob_only = false;
    }

    size_expr = pd.get(9, "");

    // count reference blobs
    if (!size_expr.empty())
    {
        const int blob_count = count_expression_blobs(size_expr);
        if (blob_count > 1)
            one_blob_only = false;
    }

    return 0;
}